

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O0

DdNode * Llb_DriverPhaseCube(Aig_Man_t *pAig,Vec_Int_t *vDriRefs,DdManager *dd)

{
  abctime aVar1;
  Vec_Ptr_t *p;
  int iVar2;
  Aig_Obj_t *pObj_00;
  DdNode *pDVar3;
  abctime TimeStop;
  int i;
  Aig_Obj_t *pObj;
  DdNode *bTemp;
  DdNode *bVar;
  DdNode *bCube;
  DdManager *dd_local;
  Vec_Int_t *vDriRefs_local;
  Aig_Man_t *pAig_local;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  bVar = Cudd_ReadOne(dd);
  Cudd_Ref(bVar);
  TimeStop._4_4_ = 0;
  while( true ) {
    iVar2 = Saig_ManRegNum(pAig);
    if (iVar2 <= TimeStop._4_4_) {
      Cudd_Deref(bVar);
      dd->TimeStop = aVar1;
      return bVar;
    }
    p = pAig->vCos;
    iVar2 = Saig_ManPoNum(pAig);
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p,TimeStop._4_4_ + iVar2);
    iVar2 = Aig_ObjFaninId0(pObj_00);
    iVar2 = Vec_IntEntry(vDriRefs,iVar2);
    if (iVar2 < 1) break;
    iVar2 = Aig_ObjFaninId0(pObj_00);
    iVar2 = Vec_IntEntry(vDriRefs,iVar2);
    if ((iVar2 == 1) && (iVar2 = Aig_ObjFaninC0(pObj_00), iVar2 != 0)) {
      iVar2 = Aig_ObjFaninId0(pObj_00);
      pDVar3 = Cudd_bddIthVar(dd,iVar2);
      pDVar3 = Cudd_bddAnd(dd,bVar,pDVar3);
      Cudd_Ref(pDVar3);
      Cudd_RecursiveDeref(dd,bVar);
      bVar = pDVar3;
    }
    TimeStop._4_4_ = TimeStop._4_4_ + 1;
  }
  __assert_fail("Vec_IntEntry( vDriRefs, Aig_ObjFaninId0(pObj) ) >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Driver.c"
                ,0x8a,"DdNode *Llb_DriverPhaseCube(Aig_Man_t *, Vec_Int_t *, DdManager *)");
}

Assistant:

DdNode * Llb_DriverPhaseCube( Aig_Man_t * pAig, Vec_Int_t * vDriRefs, DdManager * dd )
{
    DdNode * bCube, * bVar, * bTemp;
    Aig_Obj_t * pObj;
    int i;
    abctime TimeStop;
    TimeStop = dd->TimeStop; dd->TimeStop = 0;
    bCube = Cudd_ReadOne( dd );  Cudd_Ref( bCube );
    Saig_ManForEachLi( pAig, pObj, i )
    {
        assert( Vec_IntEntry( vDriRefs, Aig_ObjFaninId0(pObj) ) >= 1 );
        if ( Vec_IntEntry( vDriRefs, Aig_ObjFaninId0(pObj) ) != 1 )
            continue;
        if ( !Aig_ObjFaninC0(pObj) )
            continue;
        bVar  = Cudd_bddIthVar( dd, Aig_ObjFaninId0(pObj) );
        bCube = Cudd_bddAnd( dd, bTemp = bCube, bVar );  Cudd_Ref( bCube );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bCube );
    dd->TimeStop = TimeStop;
    return bCube;
}